

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManCreateRefs(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  uint *puVar6;
  int *piVar7;
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  size_t __nmemb;
  
  if (p->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x2d0,"void Gia_ManCreateRefs(Gia_Man_t *)");
  }
  uVar4 = p->nObjs;
  __nmemb = (size_t)(int)uVar4;
  piVar7 = (int *)calloc(__nmemb,4);
  p->pRefs = piVar7;
  if ((0 < (long)__nmemb) && (pGVar5 = p->pObjs, pGVar5 != (Gia_Obj_t *)0x0)) {
    pGVar1 = pGVar5 + __nmemb;
    sVar8 = 0;
    do {
      pGVar2 = pGVar5 + sVar8;
      iVar11 = (int)*(ulong *)pGVar2;
      uVar10 = *(ulong *)pGVar2 & 0x1fffffff;
      if (uVar10 == 0x1fffffff || iVar11 < 0) {
        if (iVar11 < 0 && (int)uVar10 != 0x1fffffff) {
          pGVar2 = pGVar2 + -uVar10;
          if ((pGVar2 < pGVar5) || (pGVar1 <= pGVar2)) goto LAB_0024020a;
          uVar10 = (ulong)((int)((ulong)((long)pGVar2 - (long)pGVar5) >> 2) * -0x55555555);
          goto LAB_002401eb;
        }
      }
      else {
        pGVar3 = pGVar2 + -uVar10;
        if ((pGVar3 < pGVar5) || (pGVar1 <= pGVar3)) {
LAB_0024020a:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        piVar7[(int)((ulong)((long)pGVar3 - (long)pGVar5) >> 2) * -0x55555555] =
             piVar7[(int)((ulong)((long)pGVar3 - (long)pGVar5) >> 2) * -0x55555555] + 1;
        uVar12 = (uint)*(ulong *)pGVar2;
        uVar9 = (uint)(*(ulong *)pGVar2 >> 0x20);
        if (((int)uVar12 < 0) ||
           ((uVar12 = uVar12 & 0x1fffffff, uVar12 == 0x1fffffff || (uVar12 != (uVar9 & 0x1fffffff)))
           )) {
          pGVar2 = pGVar2 + -(ulong)(uVar9 & 0x1fffffff);
          if ((pGVar2 < pGVar5) || (pGVar1 <= pGVar2)) goto LAB_0024020a;
          piVar7[(int)((ulong)((long)pGVar2 - (long)pGVar5) >> 2) * -0x55555555] =
               piVar7[(int)((ulong)((long)pGVar2 - (long)pGVar5) >> 2) * -0x55555555] + 1;
        }
        puVar6 = p->pMuxes;
        if ((puVar6 != (uint *)0x0) && (puVar6[sVar8] != 0)) {
          if ((int)puVar6[sVar8] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar9 = puVar6[sVar8] >> 1;
          uVar10 = (ulong)uVar9;
          if (uVar4 <= uVar9) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
LAB_002401eb:
          piVar7[uVar10] = piVar7[uVar10] + 1;
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != __nmemb);
  }
  return;
}

Assistant:

void Gia_ManCreateRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pRefs == NULL );
    p->pRefs = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjRefFanin0Inc( p, pObj );
            if ( !Gia_ObjIsBuf(pObj) )
                Gia_ObjRefFanin1Inc( p, pObj );
            if ( Gia_ObjIsMuxId(p, i) )
                Gia_ObjRefFanin2Inc( p, pObj );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjRefFanin0Inc( p, pObj );
    }
}